

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

RK_U32 __thiscall
MppBufferService::get_misc(MppBufferService *this,MppBufferMode mode,MppBufferType type)

{
  MppBufferType MVar1;
  MppBufferType type_local;
  MppBufferMode mode_local;
  MppBufferService *this_local;
  
  MVar1 = type & 0xffff;
  if (MVar1 == MPP_BUFFER_TYPE_NORMAL) {
    this_local._4_4_ = 0;
  }
  else {
    if ((1 < (int)mode) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "mode < MPP_BUFFER_MODE_BUTT","get_misc",0x458), (mpp_debug & 0x10000000) != 0))
    {
      abort();
    }
    if ((MPP_BUFFER_TYPE_DMA_HEAP < MVar1) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "type < MPP_BUFFER_TYPE_BUTT","get_misc",0x459), (mpp_debug & 0x10000000) != 0))
    {
      abort();
    }
    this_local._4_4_ = this->misc[mode][MVar1];
  }
  return this_local._4_4_;
}

Assistant:

RK_U32 MppBufferService::get_misc(MppBufferMode mode, MppBufferType type)
{
    type = (MppBufferType)(type & MPP_BUFFER_TYPE_MASK);
    if (type == MPP_BUFFER_TYPE_NORMAL)
        return 0;

    mpp_assert(mode < MPP_BUFFER_MODE_BUTT);
    mpp_assert(type < MPP_BUFFER_TYPE_BUTT);

    return misc[mode][type];
}